

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::
     PrintWithFallback<std::unordered_set<signed_char,std::hash<signed_char>,std::equal_to<signed_char>,std::allocator<signed_char>>>
               (unordered_set<signed_char,_std::hash<signed_char>,_std::equal_to<signed_char>,_std::allocator<signed_char>_>
                *value,ostream *os)

{
  ostream *os_local;
  unordered_set<signed_char,_std::hash<signed_char>,_std::equal_to<signed_char>,_std::allocator<signed_char>_>
  *value_local;
  
  ContainerPrinter::
  PrintValue<std::unordered_set<signed_char,std::hash<signed_char>,std::equal_to<signed_char>,std::allocator<signed_char>>,void>
            (value,os);
  return;
}

Assistant:

void PrintWithFallback(const T& value, ::std::ostream* os) {
  using Printer = typename FindFirstPrinter<
      T, void, ContainerPrinter, FunctionPointerPrinter, PointerPrinter,
      internal_stream_operator_without_lexical_name_lookup::StreamPrinter,
      ProtobufPrinter, ConvertibleToIntegerPrinter,
      ConvertibleToStringViewPrinter, RawBytesPrinter, FallbackPrinter>::type;
  Printer::PrintValue(value, os);
}